

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8 * google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target)

{
  uint32 uVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  anon_union_8_5_912831f5_for_data_ aVar3;
  string *str;
  bool bVar4;
  long lVar5;
  LogMessage *other;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  pointer pUVar11;
  long lVar12;
  LogFinisher local_69;
  LogMessage local_68;
  
  lVar12 = 0;
  do {
    pvVar2 = unknown_fields->fields_;
    if (pvVar2 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (long)(int)((ulong)((long)(pvVar2->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar2->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar5 <= lVar12) {
      return target;
    }
    if (pvVar2 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                 ,0x11c);
      other = LogMessage::operator<<(&local_68,"CHECK failed: fields_ != NULL: ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
    }
    pUVar11 = (unknown_fields->fields_->
              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = pUVar11[lVar12].type_;
    if (4 < uVar8) goto LAB_0033d9cb;
    pUVar11 = pUVar11 + lVar12;
    switch(uVar8) {
    case 0:
      uVar6 = (pUVar11->data_).varint_;
      uVar8 = pUVar11->number_ << 3;
      uVar10 = uVar8;
      if (0x7f < uVar8) {
        do {
          *target = (byte)uVar8 | 0x80;
          uVar10 = uVar8 >> 7;
          target = target + 1;
          bVar4 = 0x3fff < uVar8;
          uVar8 = uVar10;
        } while (bVar4);
      }
      *target = (byte)uVar10;
      pbVar7 = target + 1;
      uVar9 = uVar6;
      if (0x7f < uVar6) {
        do {
          *pbVar7 = (byte)uVar6 | 0x80;
          uVar9 = uVar6 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar9;
        } while (bVar4);
      }
      *pbVar7 = (byte)uVar9;
      goto LAB_0033d9c8;
    case 1:
      uVar1 = (pUVar11->data_).fixed32_;
      uVar6 = (ulong)(pUVar11->number_ * 8 + 5);
      if (0x7f < pUVar11->number_ << 3) {
        do {
          uVar8 = (uint)uVar6;
          *target = (byte)uVar6 | 0x80;
          uVar6 = uVar6 >> 7;
          target = target + 1;
        } while (0x3fff < uVar8);
      }
      *target = (byte)uVar6;
      *(uint32 *)(target + 1) = uVar1;
      target = target + 5;
      break;
    case 2:
      aVar3 = pUVar11->data_;
      uVar6 = (ulong)(pUVar11->number_ * 8 + 1);
      if (0x7f < pUVar11->number_ << 3) {
        do {
          uVar8 = (uint)uVar6;
          *target = (byte)uVar6 | 0x80;
          uVar6 = uVar6 >> 7;
          target = target + 1;
        } while (0x3fff < uVar8);
      }
      *target = (byte)uVar6;
      *(anon_union_8_5_912831f5_for_data_ *)(target + 1) = aVar3;
      target = target + 9;
      break;
    case 3:
      str = (string *)(pUVar11->data_).group_;
      uVar6 = (ulong)(pUVar11->number_ * 8 + 2);
      if (0x7f < pUVar11->number_ << 3) {
        do {
          uVar8 = (uint)uVar6;
          *target = (byte)uVar6 | 0x80;
          uVar6 = uVar6 >> 7;
          target = target + 1;
        } while (0x3fff < uVar8);
      }
      *target = (byte)uVar6;
      target = io::CodedOutputStream::WriteStringWithSizeToArray(str,target + 1);
      break;
    case 4:
      uVar6 = (ulong)(pUVar11->number_ * 8 + 3);
      if (0x7f < pUVar11->number_ << 3) {
        do {
          uVar8 = (uint)uVar6;
          *target = (byte)uVar6 | 0x80;
          uVar6 = uVar6 >> 7;
          target = target + 1;
        } while (0x3fff < uVar8);
      }
      *target = (byte)uVar6;
      if (pUVar11->type_ != 4) {
        __assert_fail("type() == TYPE_GROUP",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x141,"const UnknownFieldSet &google::protobuf::UnknownField::group() const")
        ;
      }
      pbVar7 = SerializeUnknownFieldsToArray((pUVar11->data_).group_,target + 1);
      uVar6 = (ulong)(pUVar11->number_ * 8 + 4);
      if (0x7f < pUVar11->number_ << 3) {
        do {
          uVar8 = (uint)uVar6;
          *pbVar7 = (byte)uVar6 | 0x80;
          uVar6 = uVar6 >> 7;
          pbVar7 = pbVar7 + 1;
        } while (0x3fff < uVar8);
      }
      *pbVar7 = (byte)uVar6;
LAB_0033d9c8:
      target = pbVar7 + 1;
    }
LAB_0033d9cb:
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

uint8* WireFormat::SerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields,
    uint8* target) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteInt64ToArray(
            field.number(), field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(
            field.number(), field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(
            field.number(), field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = WireFormatLite::WriteBytesToArray(
            field.number(), field.length_delimited(), target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = SerializeUnknownFieldsToArray(field.group(), target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}